

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O1

Status * draco::PointCloudDecoder::DecodeHeader
                   (Status *__return_storage_ptr__,DecoderBuffer *buffer,DracoHeader *out_header)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  char kIoErrorMsg [30];
  long *local_58;
  long local_50;
  long local_48 [2];
  char local_38 [32];
  
  builtin_strncpy(local_38 + 0x10,"Draco header.",0xe);
  builtin_strncpy(local_38,"Failed to parse ",0x10);
  lVar1 = buffer->pos_;
  if (buffer->data_size_ < lVar1 + 5) {
    local_58 = local_48;
    sVar4 = strlen(local_38);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,local_38,local_38 + sVar4);
    __return_storage_ptr__->code_ = IO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_58,local_50 + (long)local_58);
  }
  else {
    pcVar2 = buffer->data_;
    out_header->draco_string[4] = pcVar2[lVar1 + 4];
    *(undefined4 *)out_header->draco_string = *(undefined4 *)(pcVar2 + lVar1);
    buffer->pos_ = buffer->pos_ + 5;
    if (out_header->draco_string[4] != 'O' || *(int *)out_header->draco_string != 0x43415244) {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Not a Draco file.","");
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->error_msg_,local_58,local_50 + (long)local_58);
      if (local_58 == local_48) {
        return __return_storage_ptr__;
      }
      goto LAB_0013032b;
    }
    if (buffer->data_size_ < buffer->pos_ + 1) {
      local_58 = local_48;
      sVar4 = strlen(local_38);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,local_38,local_38 + sVar4)
      ;
      __return_storage_ptr__->code_ = IO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->error_msg_,local_58,local_50 + (long)local_58);
    }
    else {
      out_header->version_major = buffer->data_[buffer->pos_];
      lVar3 = buffer->pos_;
      lVar1 = lVar3 + 1;
      buffer->pos_ = lVar1;
      if (buffer->data_size_ < lVar3 + 2) {
        local_58 = local_48;
        sVar4 = strlen(local_38);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,local_38,local_38 + sVar4);
        __return_storage_ptr__->code_ = IO_ERROR;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->error_msg_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->error_msg_,local_58,local_50 + (long)local_58)
        ;
      }
      else {
        out_header->version_minor = buffer->data_[lVar1];
        lVar3 = buffer->pos_;
        lVar1 = lVar3 + 1;
        buffer->pos_ = lVar1;
        if (buffer->data_size_ < lVar3 + 2) {
          local_58 = local_48;
          sVar4 = strlen(local_38);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,local_38,local_38 + sVar4);
          __return_storage_ptr__->code_ = IO_ERROR;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->error_msg_).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->error_msg_,local_58,
                     local_50 + (long)local_58);
        }
        else {
          out_header->encoder_type = buffer->data_[lVar1];
          lVar3 = buffer->pos_;
          lVar1 = lVar3 + 1;
          buffer->pos_ = lVar1;
          if (buffer->data_size_ < lVar3 + 2) {
            local_58 = local_48;
            sVar4 = strlen(local_38);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,local_38,local_38 + sVar4);
            __return_storage_ptr__->code_ = IO_ERROR;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->error_msg_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->error_msg_,local_58,
                       local_50 + (long)local_58);
          }
          else {
            out_header->encoder_method = buffer->data_[lVar1];
            lVar3 = buffer->pos_;
            lVar1 = lVar3 + 1;
            buffer->pos_ = lVar1;
            if (lVar3 + 3 <= buffer->data_size_) {
              out_header->flags = *(uint16_t *)(buffer->data_ + lVar1);
              buffer->pos_ = buffer->pos_ + 2;
              __return_storage_ptr__->code_ = OK;
              (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->error_msg_).field_2;
              (__return_storage_ptr__->error_msg_)._M_string_length = 0;
              (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
              return __return_storage_ptr__;
            }
            local_58 = local_48;
            sVar4 = strlen(local_38);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,local_38,local_38 + sVar4);
            __return_storage_ptr__->code_ = IO_ERROR;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->error_msg_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->error_msg_,local_58,
                       local_50 + (long)local_58);
          }
        }
      }
    }
  }
  if (local_58 == local_48) {
    return __return_storage_ptr__;
  }
LAB_0013032b:
  operator_delete(local_58,local_48[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudDecoder::DecodeHeader(DecoderBuffer *buffer,
                                       DracoHeader *out_header) {
  constexpr char kIoErrorMsg[] = "Failed to parse Draco header.";
  if (!buffer->Decode(out_header->draco_string, 5)) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (memcmp(out_header->draco_string, "DRACO", 5) != 0) {
    return Status(Status::DRACO_ERROR, "Not a Draco file.");
  }
  if (!buffer->Decode(&(out_header->version_major))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->version_minor))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->encoder_type))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->encoder_method))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->flags))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  return OkStatus();
}